

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_inlets.h
# Opt level: O1

void * proxy_new(void *x,long id,long *stuffloc)

{
  vector<c74::max::t_mock_inlet,_std::allocator<c74::max::t_mock_inlet>_> *this;
  pointer ptVar1;
  t_mock_inlet inlet;
  vector<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>,_std::allocator<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>_>_>
  local_40;
  long local_28;
  long *plStack_20;
  
  this = *(vector<c74::max::t_mock_inlet,_std::allocator<c74::max::t_mock_inlet>_> **)
          ((long)x + 0x10);
  local_40.
  super__Vector_base<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>,_std::allocator<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_40.
  super__Vector_base<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>,_std::allocator<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40.
  super__Vector_base<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>,_std::allocator<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28 = id;
  plStack_20 = stuffloc;
  if ((ulong)(((long)(this->
                     super__Vector_base<c74::max::t_mock_inlet,_std::allocator<c74::max::t_mock_inlet>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->
                     super__Vector_base<c74::max::t_mock_inlet,_std::allocator<c74::max::t_mock_inlet>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555) <
      id + 1U) {
    std::vector<c74::max::t_mock_inlet,_std::allocator<c74::max::t_mock_inlet>_>::resize
              (this,id + 1U);
  }
  ptVar1 = (this->
           super__Vector_base<c74::max::t_mock_inlet,_std::allocator<c74::max::t_mock_inlet>_>).
           _M_impl.super__Vector_impl_data._M_start;
  ptVar1[id].m_owner = x;
  std::
  vector<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>,_std::allocator<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>_>_>
  ::operator=(&ptVar1[id].m_messages,&local_40);
  ptVar1[id].m_id = local_28;
  ptVar1[id].m_stuffloc = plStack_20;
  std::
  vector<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>,_std::allocator<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>_>_>
  ::~vector(&local_40);
  return (void *)0x0;
}

Assistant:

MOCK_EXPORT void *proxy_new(void *x, long id, long *stuffloc)
{
    t_object		*o = (t_object*)x;
    object_inlets	*inlets = (object_inlets*)o->o_inlet;
    t_mock_inlets&	mock_inlets = inlets->mock_inlets;

    t_mock_inlet inlet(x, id, stuffloc);

    if (id+1 > mock_inlets.size())
        mock_inlets.resize(id+1);
    mock_inlets[id] = inlet;
    return NULL;
}